

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_headers_parser.h
# Opt level: O1

void __thiscall
cppcms::impl::cgi_headers_parser::consume<cppcms::impl::cgi::connection>
          (cgi_headers_parser *this,char **data,size_t *length,connection *conn)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  
  if ((this->completed_ == false) && (*length != 0)) {
    do {
      *data = *data + 1;
      std::__cxx11::string::push_back((char)this);
      *length = *length - 1;
      uVar1 = (this->header_)._M_string_length;
      if (((uVar1 < 2) || (pcVar2 = (this->header_)._M_dataplus._M_p, pcVar2[uVar1 - 2] != '\r')) ||
         (pcVar2[uVar1 - 1] != '\n')) {
LAB_001c6702:
        bVar3 = false;
      }
      else {
        if (uVar1 != 2) {
          add_header(this);
          goto LAB_001c6702;
        }
        (*conn->_vptr_connection[3])(conn,&this->h_);
        this->completed_ = true;
        bVar3 = true;
      }
    } while ((!bVar3) && (*length != 0));
  }
  return;
}

Assistant:

void consume(char const *&data,size_t &length,Conn &conn)
	{
		if(completed_)
			return;
		while(length > 0) {
			header_ += *data++;
			length--;
			size_t size = header_.size();
			if(size >= 2 && header_[size-2] == '\r' && header_[size-1] == '\n') {
				if(size == 2) {
					conn.set_response_headers(h_);
					completed_ = true;
					return;
				}
				add_header();
			}
		}
	}